

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_598a4::CpuAbsoluteIndexedTest_rra_carry_but_no_overflow_without_pagecrossing_Test
::~CpuAbsoluteIndexedTest_rra_carry_but_no_overflow_without_pagecrossing_Test
          (CpuAbsoluteIndexedTest_rra_carry_but_no_overflow_without_pagecrossing_Test *this)

{
  CpuAbsoluteIndexedTest_rra_carry_but_no_overflow_without_pagecrossing_Test *this_local;
  
  ~CpuAbsoluteIndexedTest_rra_carry_but_no_overflow_without_pagecrossing_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, rra_carry_but_no_overflow_without_pagecrossing) {
    registers.a = 0xD0;
    registers.p = V_FLAG;
    expected.p = C_FLAG;
    expected.a = 0x20;
    memory_content = 0xA0;

    run_readwrite_instruction_without_pagecrossing(RRA_ABSY, IndexReg::Y, 0x50);
}